

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_Data_PDU::Minefield_Data_PDU
          (Minefield_Data_PDU *this,EntityIdentifier *MinefieldID,
          EntityIdentifier *RequestingSimulationID,KUINT16 SeqNum,KUINT8 RequestID,KUINT8 PduSeqNum,
          KUINT8 NumPdus,MinefieldDataFilter *DF,EntityType *MineType)

{
  KUINT16 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Data_PDU_00222ff0;
  (this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00224f60;
  KVar1 = (RequestingSimulationID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_ReqID).super_SimulationIdentifier.m_ui16SiteID =
       (RequestingSimulationID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_ReqID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00224c00;
  *(undefined2 *)&(this->m_ReqID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(RequestingSimulationID->super_SimulationIdentifier).field_0xc;
  this->m_ui8ReqID = RequestID;
  this->m_ui8PduSeqNum = PduSeqNum;
  this->m_ui8NumPdus = NumPdus;
  this->m_ui8NumMines = '\0';
  this->m_ui8NumSensTyp = '\0';
  this->m_ui8Padding1 = '\0';
  (this->m_DataFilter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__MinefieldDataFilter_00226210;
  (this->m_DataFilter).m_FilterUnion = DF->m_FilterUnion;
  (this->m_MineTyp).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00224cb0;
  KVar2 = MineType->m_ui8Domain;
  KVar1 = MineType->m_ui16Country;
  KVar3 = MineType->m_ui8Category;
  KVar4 = MineType->m_ui8SubCategory;
  KVar5 = MineType->m_ui8Specific;
  KVar6 = MineType->m_ui8Extra;
  (this->m_MineTyp).m_ui8EntityKind = MineType->m_ui8EntityKind;
  (this->m_MineTyp).m_ui8Domain = KVar2;
  (this->m_MineTyp).m_ui16Country = KVar1;
  (this->m_MineTyp).m_ui8Category = KVar3;
  (this->m_MineTyp).m_ui8SubCategory = KVar4;
  (this->m_MineTyp).m_ui8Specific = KVar5;
  (this->m_MineTyp).m_ui8Extra = KVar6;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vMines).super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vMines).super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vMines).super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '\'';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x2c;
  (this->m_SeqNumUnion).m_ui16SeqNum = ((this->m_SeqNumUnion).m_ui16SeqNum & 1) + SeqNum * 2;
  KVar1 = (MinefieldID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.m_ui16SiteID =
       (MinefieldID->super_SimulationIdentifier).m_ui16SiteID;
  (this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar1;
  *(undefined2 *)&(this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.field_0xc
       = *(undefined2 *)&(MinefieldID->super_SimulationIdentifier).field_0xc;
  return;
}

Assistant:

Minefield_Data_PDU::Minefield_Data_PDU( const EntityIdentifier & MinefieldID, const EntityIdentifier & RequestingSimulationID,
                                        KUINT16 SeqNum, KUINT8 RequestID, KUINT8 PduSeqNum, KUINT8 NumPdus,
                                        const MinefieldDataFilter & DF, const EntityType & MineType ) :
    m_ReqID( RequestingSimulationID ),
    m_ui8ReqID( RequestID ),
    m_ui8PduSeqNum( PduSeqNum ),
    m_ui8NumPdus( NumPdus ),
    m_DataFilter( DF ),
    m_MineTyp( MineType ),
    m_ui8NumMines( 0 ),
    m_ui8NumSensTyp( 0 ),
    m_ui8Padding1( 0 )
{
    m_ui8PDUType = MinefieldData_PDU_Type;
    m_ui16PDULength = MINEFIELD_DATA_PDU_SIZE;
    m_SeqNumUnion.m_ui16SeqNum15 = SeqNum;
    m_MinefieldID = MinefieldID;
}